

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

boolean cant_create(int *mtype,boolean revival)

{
  boolean revival_local;
  int *mtype_local;
  
  if (((*mtype == 0x11c) || (((*mtype == 0x11a && (revival == '\0')) || (*mtype == 0x11f)))) ||
     (*mtype == 0x7f)) {
    *mtype = 0xfa;
    mtype_local._7_1_ = '\x01';
  }
  else if (*mtype == 0x158) {
    *mtype = 0x76;
    mtype_local._7_1_ = '\x01';
  }
  else {
    mtype_local._7_1_ = '\0';
  }
  return mtype_local._7_1_;
}

Assistant:

boolean cant_create(int *mtype, boolean revival)
{

	/* SHOPKEEPERS can be revived now */
	if (*mtype==PM_GUARD || (*mtype==PM_SHOPKEEPER && !revival)
	     || *mtype==PM_ALIGNED_PRIEST || *mtype==PM_ANGEL) {
		*mtype = PM_HUMAN_ZOMBIE;
		return TRUE;
	} else if (*mtype==PM_LONG_WORM_TAIL) {	/* for create_particular() */
		*mtype = PM_LONG_WORM;
		return TRUE;
	}
	return FALSE;
}